

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::GetObjectLibrariesCMP0026
          (cmTarget *this,vector<cmTarget_*,_std::allocator<cmTarget_*>_> *objlibs)

{
  pointer *arg;
  bool bVar1;
  bool bVar2;
  cmTargetInternals *pcVar3;
  reference ppTVar4;
  cmCompiledGeneratorExpression *this_00;
  string *psVar5;
  reference pbVar6;
  char *pcVar7;
  pointer pbVar8;
  size_type sVar9;
  cmTarget *local_e0;
  cmTarget *objLib;
  undefined1 local_d0 [8];
  string objLibName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  const_iterator li;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string entry;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_28;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_20;
  const_iterator i;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *objlibs_local;
  cmTarget *this_local;
  
  i._M_current = (TargetPropertyEntry **)objlibs;
  pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
  local_28._M_current =
       (TargetPropertyEntry **)
       std::
       vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       ::begin(&pcVar3->SourceEntries);
  __gnu_cxx::
  __normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
  ::__normal_iterator<cmTargetInternals::TargetPropertyEntry**>
            ((__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
              *)&local_20,&local_28);
  while( true ) {
    pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
    entry.field_2._8_8_ =
         std::
         vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ::end(&pcVar3->SourceEntries);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                        *)((long)&entry.field_2 + 8));
    if (!bVar1) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&local_20);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
    psVar5 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(this_00);
    arg = &files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)arg,(string *)psVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    cmSystemTools::ExpandListArgument
              ((string *)arg,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,false);
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_80,&local_88);
    while( true ) {
      local_90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
      if (!bVar1) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_80);
      std::__cxx11::string::string((string *)(objLibName.field_2._M_local_buf + 8),(string *)pbVar6)
      ;
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&objLibName.field_2 + 8),(char (*) [18])"$<TARGET_OBJECTS:");
      bVar1 = false;
      if (bVar2) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_80);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_80);
        std::__cxx11::string::size();
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pbVar6);
        bVar1 = *pcVar7 == '>';
      }
      std::__cxx11::string::~string((string *)(objLibName.field_2._M_local_buf + 8));
      if (bVar1) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_80);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_80);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_d0,(ulong)pbVar8);
        sVar9 = cmGeneratorExpression::Find((string *)local_d0);
        if (sVar9 == 0xffffffffffffffff) {
          local_e0 = cmMakefile::FindTargetToUse(this->Makefile,(string *)local_d0,false);
          if (local_e0 != (cmTarget *)0x0) {
            std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
                      ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)i._M_current,&local_e0);
          }
          objLib._4_4_ = 0;
        }
        else {
          objLib._4_4_ = 7;
        }
        std::__cxx11::string::~string((string *)local_d0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_80);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::__cxx11::string::~string
              ((string *)
               &files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void
cmTarget::GetObjectLibrariesCMP0026(std::vector<cmTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  typedef cmTargetInternals::TargetPropertyEntry
                              TargetPropertyEntry;
  for(std::vector<TargetPropertyEntry*>::const_iterator
        i = this->Internal->SourceEntries.begin();
      i != this->Internal->SourceEntries.end(); ++i)
    {
    std::string entry = (*i)->ge->GetInput();

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator
        li = files.begin(); li != files.end(); ++li)
      {
      if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>')
        {
        std::string objLibName = li->substr(17, li->size()-18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
          {
          continue;
          }
        cmTarget *objLib = this->Makefile->FindTargetToUse(objLibName);
        if(objLib)
          {
          objlibs.push_back(objLib);
          }
        }
      }
    }
}